

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void opengv::relative_pose::modules::fivept_nister_main
               (Matrix<double,_9,_4,_0,_9,_4> *EE,essentials_t *essentials)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  iterator __position;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined8 *puVar19;
  double *pdVar20;
  pointer pdVar21;
  Index size;
  long lVar22;
  double dVar23;
  pointer pdVar24;
  Index index_1;
  double *pdVar25;
  double dVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  double *pdVar33;
  ulong uVar34;
  long lVar35;
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  *this;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  MatrixXd norms;
  MatrixXd EvecNorms;
  vector<double,_std::allocator<double>_> roots;
  essential_t essential;
  MatrixXd Evec;
  double y;
  double x;
  Sturm sturmSequence;
  Matrix<double,_1,_4,_1,_1,_4> b22;
  Matrix<double,_1,_4,_1,_1,_4> b21;
  Matrix<double,_1,_11,_1,_1,_11> p_order10;
  Matrix<double,_1,_4,_1,_1,_4> b32;
  Matrix<double,_1,_4,_1,_1,_4> b12;
  Matrix<double,_1,_4,_1,_1,_4> b31;
  Matrix<double,_1,_4,_1,_1,_4> b11;
  Matrix<double,_1,_7,_1,_1,_7> p3;
  Matrix<double,_1,_5,_1,_1,_5> b33;
  Matrix<double,_1,_8,_1,_1,_8> p2;
  Matrix<double,_1,_8,_1,_1,_8> p1;
  Matrix<double,_1,_5,_1,_1,_5> b23;
  Matrix<double,_1,_5,_1,_1,_5> b13;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part2;
  Matrix<double,_1,_7,_1,_1,_7> p3_part2;
  Matrix<double,_1,_7,_1,_1,_7> p3_part1;
  Matrix<double,_1,_8,_1,_1,_8> p2_part2;
  Matrix<double,_1,_8,_1,_1,_8> p2_part1;
  Matrix<double,_1,_8,_1,_1,_8> p1_part2;
  Matrix<double,_1,_8,_1,_1,_8> p1_part1;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part3;
  Matrix<double,_1,_11,_1,_1,_11> p_order10_part1;
  Matrix<double,_10,_20,_0,_10,_20> A;
  Matrix<double,_10,_10,_0,_10,_10> A3;
  Matrix<double,_10,_10,_0,_10,_10> A2;
  undefined1 local_1af0 [16];
  long local_1ae0;
  DenseStorage<double,__1,__1,__1,_0> local_1ad0;
  vector<double,_std::allocator<double>_> local_1ab8;
  Matrix<double,_3,_3,_0,_3,_3> local_1aa0;
  DenseStorage<double,__1,__1,__1,_0> local_1a50;
  double local_1a30;
  double local_1a28;
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  *local_1a20;
  double local_1a18;
  double local_1a10;
  Sturm local_1a08;
  DenseStorage<double,_4,_1,_4,_1> local_19e0;
  DenseStorage<double,_4,_1,_4,_1> local_19c0;
  double local_19a0 [4];
  double local_1980;
  double dStack_1978;
  double local_1970;
  double dStack_1968;
  double local_1960;
  double dStack_1958;
  double local_1950;
  DenseStorage<double,_4,_1,_4,_1> local_1940;
  DenseStorage<double,_4,_1,_4,_1> local_1920;
  DenseStorage<double,_4,_1,_4,_1> local_1900;
  DenseStorage<double,_4,_1,_4,_1> local_18e0;
  undefined1 local_18b0 [32];
  undefined1 local_1890 [16];
  double local_1880;
  undefined1 local_1870 [16];
  undefined1 local_1860 [16];
  double local_1850;
  DenseStorage<double,_8,_1,_8,_1> local_1840;
  DenseStorage<double,_8,_1,_8,_1> local_1800;
  undefined1 local_17c0 [16];
  undefined1 local_17b0 [16];
  double local_17a0;
  undefined1 local_1790 [16];
  undefined1 local_1780 [16];
  double local_1770;
  Matrix<double,_1,_11,_1,_1,_11> local_1760;
  undefined1 local_1700 [16];
  undefined1 local_16f0 [16];
  undefined1 local_16e0 [16];
  double local_16d0;
  undefined1 local_16c0 [16];
  undefined1 local_16b0 [16];
  undefined1 local_16a0 [16];
  double local_1690;
  PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> local_1680;
  PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> local_1640;
  plain_array<double,_8,_1,_64> local_1600;
  plain_array<double,_8,_1,_64> local_15c0;
  Matrix<double,_1,_11,_1,_1,_11> local_1580;
  Inverse<Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>_> local_1520;
  Matrix<double,_10,_10,_0,_10,_10> *local_1120;
  Matrix<double,_10,_20,_0,_10,_20> local_1100;
  undefined1 local_ac0 [592];
  double local_870;
  double dStack_868;
  double local_860;
  double dStack_858;
  double local_850;
  double dStack_848;
  double local_820;
  double local_818;
  double dStack_810;
  double local_808;
  double dStack_800;
  undefined1 local_7f8 [16];
  double local_7d0;
  double local_7c8;
  double local_7c0;
  double local_7b8;
  double local_7b0;
  double local_7a8;
  Matrix<double,_10,_10,_0,_10,_10> local_7a0;
  FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_> local_480;
  
  local_1a20 = (vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)essentials;
  fivept_nister::composeA(EE,&local_1100);
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[100];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [1] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x65];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [2] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x66];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [3] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x67];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [4] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x68];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [5] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x69];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [6] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x6a];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [7] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x6b];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [8] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x6c];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [9] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.m_data
        .array[0x6d];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [10] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
         m_data.array[0x6e];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0xb] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
          m_data.array[0x6f];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0xc] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
          m_data.array[0x70];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0xd] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
          m_data.array[0x71];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0xe] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
          m_data.array[0x72];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0xf] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
          m_data.array[0x73];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x10] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x74];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x11] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x75];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x12] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x76];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x13] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x77];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x14] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x78];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x15] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x79];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x16] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7a];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x17] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7b];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x18] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7c];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x19] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7d];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7e];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x7f];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x80];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x81];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x82];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x1f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x83];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x20] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x84];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x21] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x85];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x22] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x86];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x23] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x87];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x24] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x88];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x25] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x89];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x26] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8a];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x27] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8b];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x28] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8c];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x29] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8d];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8e];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x8f];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x90];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x91];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x92];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x2f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x93];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x30] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x94];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x31] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x95];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x32] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x96];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x33] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x97];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x34] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x98];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x35] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x99];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x36] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9a];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x37] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9b];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x38] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9c];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x39] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9d];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9e];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0x9f];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa0];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa1];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa2];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x3f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa3];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x40] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa4];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x41] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa5];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x42] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa6];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x43] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa7];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x44] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa8];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x45] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xa9];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x46] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xaa];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x47] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xab];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x48] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xac];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x49] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xad];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xae];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xaf];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb0];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb1];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb2];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x4f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb3];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x50] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb4];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x51] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb5];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x52] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb6];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x53] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb7];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x54] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb8];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x55] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xb9];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x56] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xba];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x57] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xbb];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x58] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xbc];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x59] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xbd];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xbe];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xbf];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc0];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc1];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc2];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x5f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc3];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[0];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[1] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[1];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[2] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[2];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[3] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[3];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[4] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[4];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[5] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[5];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[6] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[6];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[7] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[7];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[8] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[8];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[9] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
             m_data.array[9];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[10] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
              m_data.array[10];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xb] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage
               .m_data.array[0xb];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xc] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage
               .m_data.array[0xc];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xd] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage
               .m_data.array[0xd];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xe] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage
               .m_data.array[0xe];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0xf] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage
               .m_data.array[0xf];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x10] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x10];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x11] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x11];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x12] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x12];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x13] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x13];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x14] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x14];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x15] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x15];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x16] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x16];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x17] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x17];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x18] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x18];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x19] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x19];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1a];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1b];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1c];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1d];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1e];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x1f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x1f];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x20] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x20];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x21] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x21];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x22] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x22];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x23] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x23];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x24] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x24];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x25] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x25];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x26] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x26];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x27] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x27];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x28] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x28];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x29] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x29];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2a];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2b];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2c];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2d];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2e];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x2f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x2f];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x30] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x30];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x31] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x31];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x32] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x32];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x33] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x33];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x34] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x34];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x35] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x35];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x36] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x36];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x37] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x37];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x38] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x38];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x39] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x39];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3a];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3b];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3c];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3d];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3e];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x3f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x3f];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x40] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x40];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x41] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x41];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x42] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x42];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x43] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x43];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x44] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x44];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x45] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x45];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x46] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x46];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x47] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x47];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x48] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x48];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x49] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x49];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4a];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4b];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4c];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4d];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4e];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x4f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x4f];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x50] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x50];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x51] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x51];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x52] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x52];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x53] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x53];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x54] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x54];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x55] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x55];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x56] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x56];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x57] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x57];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x58] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x58];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x59] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x59];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5a] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5a];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5b] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5b];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5c] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5c];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5d] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5d];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5e] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5e];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x5f] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x5f];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x60] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x60];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x61] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x61];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[0x62] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.
                m_storage.m_data.array[0x62];
  local_480.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
  array[99] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
              m_data.array[99];
  local_480.m_isInitialized = false;
  local_480.m_usePrescribedThreshold = false;
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x60] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc4];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x61] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc5];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [0x62] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
           m_data.array[0xc6];
  local_7a0.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.array
  [99] = local_1100.super_PlainObjectBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_>.m_storage.
         m_data.array[199];
  Eigen::FullPivLU<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>::computeInPlace(&local_480);
  memcpy(&local_1520,&local_480,800);
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[8] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[8];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[9] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[9];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[0] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[0];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[1] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[1];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[2] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[2];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[3] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[3];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[4] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[4];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[5] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[5];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[6] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[6];
  local_1520.m_xpr.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[7] =
       local_480.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[7];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[0] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[0];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[1] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[1];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[2] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[2];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[3] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[3];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[4] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[4];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[5] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[5];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[6] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[6];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[7] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[7];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[8] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[8];
  local_1520.m_xpr.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[9] =
       local_480.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.m_storage
       .m_data.array[9];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[0] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[0];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[1] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[1];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[2] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[2];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[3] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[3];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[4] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[4];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[5] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[5];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[6] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[6];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[7] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[7];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[8] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[8];
  local_1520.m_xpr.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
  m_storage.m_data.array[9] =
       local_480.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_10,_1,_0,_10,_1>_>.
       m_storage.m_data.array[9];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[0] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[0];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[1] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[1];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[2] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[2];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[3] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[3];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[4] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[4];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[5] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[5];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[6] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[6];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[7] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[7];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[8] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[8];
  local_1520.m_xpr.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
  m_storage.m_data.array[9] =
       local_480.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,_10,_1,_1,_10>_>.
       m_storage.m_data.array[9];
  local_1520.m_xpr.m_nonzero_pivots = local_480.m_nonzero_pivots;
  local_1520.m_xpr.m_l1_norm = local_480.m_l1_norm;
  local_1520.m_xpr.m_maxpivot = local_480.m_maxpivot;
  local_1520.m_xpr._992_3_ =
       SUB43(CONCAT22(local_480._993_2_,
                      CONCAT11(local_480.m_det_pq,local_480.m_prescribedThreshold._7_1_)) >> 8,0);
  local_1520.m_xpr.m_prescribedThreshold._7_1_ = local_480.m_prescribedThreshold._7_1_;
  local_1120 = &local_7a0;
  memset((Matrix<double,_10,_10,_0,_10,_10> *)local_ac0,0,800);
  local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.array
  [0] = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Inverse<Eigen::FullPivLU<Eigen::Matrix<double,10,10,0,10,10>>>,Eigen::Matrix<double,10,10,0,10,10>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,10,10,0,10,10>>
            ((Matrix<double,_10,_10,_0,_10,_10> *)local_ac0,&local_1520,&local_7a0,
             (Scalar *)&local_1760);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_ac0._112_8_;
  auVar13 = vmovhpd_avx(ZEXT816(0) << 0x40,local_ac0._32_8_);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_ac0._40_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_ac0._128_8_;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_ac0._56_8_;
  auVar14 = vmovhpd_avx(auVar69,local_ac0._192_8_);
  auVar15 = vmovhpd_avx(auVar51,local_ac0._120_8_);
  auVar45._16_16_ = auVar14;
  auVar45._0_16_ = auVar13;
  auVar57._16_8_ = local_ac0._200_8_;
  auVar57._0_16_ = auVar15;
  auVar57._24_8_ = 0;
  local_18e0.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar45,auVar57);
  auVar13 = vmovhpd_avx(auVar70,local_ac0._208_8_);
  auVar71 = ZEXT816(0);
  auVar14 = vmovhpd_avx(ZEXT816(0),local_ac0._48_8_);
  auVar46._16_16_ = auVar13;
  auVar46._0_16_ = auVar14;
  auVar13 = vmovhpd_avx(auVar63,local_ac0._136_8_);
  auVar58._16_8_ = local_ac0._216_8_;
  auVar58._0_16_ = auVar13;
  auVar58._24_8_ = 0;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_ac0._144_8_;
  auVar13 = vmovhpd_avx(auVar64,local_ac0._224_8_);
  local_19c0.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar46,auVar58);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_ac0._72_8_;
  auVar14 = vmovhpd_avx(auVar52,local_ac0._152_8_);
  auVar15 = vmovhpd_avx(ZEXT816(0),local_ac0._64_8_);
  auVar47._16_16_ = auVar13;
  auVar47._0_16_ = auVar15;
  auVar59._16_8_ = local_ac0._232_8_;
  auVar59._0_16_ = auVar14;
  auVar59._24_8_ = 0;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_ac0._352_8_;
  auVar13 = vmovhpd_avx(auVar65,local_ac0._432_8_);
  local_1900.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar47,auVar59);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_ac0._280_8_;
  auVar14 = vmovhpd_avx(auVar53,local_ac0._360_8_);
  auVar15 = vmovhpd_avx(auVar71,local_ac0._272_8_);
  auVar60._16_8_ = local_ac0._440_8_;
  auVar60._0_16_ = auVar14;
  auVar60._24_8_ = 0;
  auVar48._16_16_ = auVar13;
  auVar48._0_16_ = auVar15;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_ac0._368_8_;
  auVar13 = vmovhpd_avx(auVar66,local_ac0._448_8_);
  local_1920.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar48,auVar60);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_ac0._296_8_;
  auVar14 = vmovhpd_avx(auVar54,local_ac0._376_8_);
  auVar15 = vmovhpd_avx(auVar71,local_ac0._288_8_);
  auVar61._16_8_ = local_ac0._456_8_;
  auVar61._0_16_ = auVar14;
  auVar61._24_8_ = 0;
  auVar49._16_16_ = auVar13;
  auVar49._0_16_ = auVar15;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_ac0._384_8_;
  auVar13 = vmovhpd_avx(auVar67,local_ac0._464_8_);
  local_19e0.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar49,auVar61);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_ac0._312_8_;
  auVar14 = vmovhpd_avx(auVar55,local_ac0._392_8_);
  auVar15 = vmovhpd_avx(auVar71,local_ac0._304_8_);
  auVar62._16_8_ = local_ac0._472_8_;
  auVar62._0_16_ = auVar14;
  auVar62._24_8_ = 0;
  auVar14._8_8_ = local_ac0._528_8_;
  auVar14._0_8_ = local_ac0._520_8_;
  auVar14 = vmovhpd_avx(auVar14,dStack_868);
  auVar50._16_16_ = auVar13;
  auVar50._0_16_ = auVar15;
  local_1940.m_data.array = (plain_array<double,_4,_1,_32>)vsubpd_avx(auVar50,auVar62);
  auVar15._8_8_ = dStack_868;
  auVar15._0_8_ = local_870;
  auVar13 = vmovhpd_avx(auVar15,local_820);
  auVar15 = vmovhpd_avx(auVar71,local_ac0._512_8_);
  local_1790 = vsubpd_avx(auVar15,auVar14);
  auVar17._8_8_ = dStack_810;
  auVar17._0_8_ = local_818;
  auVar14 = vmovhpd_avx(auVar17,local_7c8);
  auVar15 = vmovhpd_avx(auVar71,local_ac0._528_8_);
  local_1780 = vsubpd_avx(auVar13,auVar14);
  auVar13._8_8_ = local_ac0._544_8_;
  auVar13._0_8_ = local_ac0._536_8_;
  auVar13 = vmovhpd_avx(auVar13,dStack_858);
  auVar16._8_8_ = dStack_858;
  auVar16._0_8_ = local_860;
  local_1770 = local_7d0;
  auVar14 = vmovhpd_avx(auVar16,dStack_810);
  local_17c0 = vsubpd_avx(auVar15,auVar13);
  auVar18._8_8_ = dStack_800;
  auVar18._0_8_ = local_808;
  auVar13 = vmovhpd_avx(auVar18,local_7b8);
  auVar15 = vmovhpd_avx(auVar71,local_ac0._544_8_);
  local_17b0 = vsubpd_avx(auVar14,auVar13);
  auVar13 = vmovhpd_avx(local_ac0._552_16_,dStack_848);
  auVar71._8_8_ = dStack_848;
  auVar71._0_8_ = local_850;
  local_17a0 = local_7c0;
  auVar14 = vmovhpd_avx(auVar71,dStack_800);
  local_1870 = vsubpd_avx(auVar15,auVar13);
  auVar13 = vmovhpd_avx(local_7f8,local_7a8);
  local_1860 = vsubpd_avx(auVar14,auVar13);
  local_1850 = local_7b0;
  fivept_nister::computeSeventhOrderPolynomial
            ((Matrix<double,_1,_5,_1,_1,_5> *)local_17c0,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1920,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_15c0);
  fivept_nister::computeSeventhOrderPolynomial
            ((Matrix<double,_1,_5,_1,_1,_5> *)local_1790,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_19e0,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_1600);
  local_1800.m_data.array =
       (plain_array<double,_8,_1,_64>)
       vsubpd_avx512f((undefined1  [64])local_15c0.array,(undefined1  [64])local_1600.array);
  fivept_nister::computeSeventhOrderPolynomial
            ((Matrix<double,_1,_5,_1,_1,_5> *)local_1790,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_19c0,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_1640);
  fivept_nister::computeSeventhOrderPolynomial
            ((Matrix<double,_1,_5,_1,_1,_5> *)local_17c0,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_18e0,
             (Matrix<double,_1,_8,_1,_1,_8> *)&local_1680);
  local_1840.m_data.array =
       (plain_array<double,_8,_1,_64>)
       vsubpd_avx512f((undefined1  [64])local_1640.m_storage.m_data.array,
                      (undefined1  [64])local_1680.m_storage.m_data.array);
  fivept_nister::computeSixthOrderPolynomial
            ((Matrix<double,_1,_4,_1,_1,_4> *)&local_18e0,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_19e0,
             (Matrix<double,_1,_7,_1,_1,_7> *)local_16c0);
  fivept_nister::computeSixthOrderPolynomial
            ((Matrix<double,_1,_4,_1,_1,_4> *)&local_1920,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_19c0,
             (Matrix<double,_1,_7,_1,_1,_7> *)local_1700);
  local_18b0._0_16_ = vsubpd_avx(local_16c0,local_1700);
  local_18b0._16_16_ = vsubpd_avx(local_16b0,local_16f0);
  local_1890 = vsubpd_avx(local_16a0,local_16e0);
  local_1880 = local_1690 - local_16d0;
  fivept_nister::computeTenthOrderPolynomialFrom73
            ((Matrix<double,_1,_8,_1,_1,_8> *)&local_1800,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1900,
             (Matrix<double,_1,_11,_1,_1,_11> *)&local_1520);
  fivept_nister::computeTenthOrderPolynomialFrom73
            ((Matrix<double,_1,_8,_1,_1,_8> *)&local_1840,
             (Matrix<double,_1,_4,_1,_1,_4> *)&local_1940,&local_1760);
  fivept_nister::computeTenthOrderPolynomialFrom64
            ((Matrix<double,_1,_7,_1,_1,_7> *)local_18b0,(Matrix<double,_1,_5,_1,_1,_5> *)local_1870
             ,&local_1580);
  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
       = 0.0;
  local_19a0[0] =
       local_1520.m_xpr.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
       m_storage.m_data.array[0] +
       local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[0] +
       local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[0];
  local_19a0[1] =
       local_1520.m_xpr.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
       m_storage.m_data.array[1] +
       local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[1] +
       local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[1];
  local_19a0[2] =
       local_1520.m_xpr.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
       m_storage.m_data.array[2] +
       local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[2] +
       local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[2];
  local_19a0[3] =
       local_1520.m_xpr.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.
       m_storage.m_data.array[3] +
       local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[3] +
       local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.m_data.
       array[3];
  local_1980 = local_1520.m_xpr.m_lu.
               super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
               array[4] +
               local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[4] +
               local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[4];
  dStack_1978 = local_1520.m_xpr.m_lu.
                super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
                array[5] +
                local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[5] +
                local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[5];
  local_1970 = local_1520.m_xpr.m_lu.
               super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
               array[6] +
               local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[6] +
               local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[6];
  dStack_1968 = local_1520.m_xpr.m_lu.
                super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
                array[7] +
                local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[7] +
                local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[7];
  local_1960 = local_1520.m_xpr.m_lu.
               super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
               array[8] +
               local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[8] +
               local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[8];
  dStack_1958 = local_1520.m_xpr.m_lu.
                super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
                array[9] +
                local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[9] +
                local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
                m_data.array[9];
  local_1950 = local_1520.m_xpr.m_lu.
               super_PlainObjectBase<Eigen::Matrix<double,_10,_10,_0,_10,_10>_>.m_storage.m_data.
               array[10] +
               local_1760.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[10] +
               local_1580.super_PlainObjectBase<Eigen::Matrix<double,_1,_11,_1,_1,_11>_>.m_storage.
               m_data.array[10];
  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array.
  _0_16_ = ZEXT816(0);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,0xb,1,0xb);
  if ((local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
       array[1] != 4.94065645841247e-324) ||
     (dVar42 = 5.43472210425371e-323, dVar23 = 4.94065645841247e-324,
     local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
     [2] != 5.43472210425371e-323)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,0xb,1,0xb);
    if ((long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array[2] < 1) goto LAB_0016fda8;
    dVar42 = local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[2];
    dVar23 = local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[1];
  }
  auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  dVar26 = 0.0;
  auVar37 = vpbroadcastq_avx512f();
  pdVar20 = (double *)
            local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
            .array[0];
  do {
    if (0 < (long)dVar23) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_19a0[(long)dVar26];
      auVar38 = vbroadcastsd_avx512f(auVar1);
      uVar29 = 0;
      do {
        auVar39 = vpbroadcastq_avx512f();
        auVar39 = vporq_avx512f(auVar39,auVar36);
        uVar34 = vpcmpuq_avx512f(auVar39,auVar37,2);
        pdVar25 = pdVar20 + uVar29;
        bVar6 = (bool)((byte)uVar34 & 1);
        bVar7 = (bool)((byte)(uVar34 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar34 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar34 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar34 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar34 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar34 >> 6) & 1);
        *pdVar25 = (double)((ulong)bVar6 * auVar38._0_8_ | (ulong)!bVar6 * (long)*pdVar25);
        pdVar25[1] = (double)((ulong)bVar7 * auVar38._8_8_ | (ulong)!bVar7 * (long)pdVar25[1]);
        pdVar25[2] = (double)((ulong)bVar8 * auVar38._16_8_ | (ulong)!bVar8 * (long)pdVar25[2]);
        pdVar25[3] = (double)((ulong)bVar9 * auVar38._24_8_ | (ulong)!bVar9 * (long)pdVar25[3]);
        pdVar25[4] = (double)((ulong)bVar10 * auVar38._32_8_ | (ulong)!bVar10 * (long)pdVar25[4]);
        pdVar25[5] = (double)((ulong)bVar11 * auVar38._40_8_ | (ulong)!bVar11 * (long)pdVar25[5]);
        pdVar25[6] = (double)((ulong)bVar12 * auVar38._48_8_ | (ulong)!bVar12 * (long)pdVar25[6]);
        pdVar25[7] = (double)((uVar34 >> 7) * auVar38._56_8_ |
                             (ulong)!SUB81(uVar34 >> 7,0) * (long)pdVar25[7]);
        uVar29 = uVar29 + 8;
      } while (((long)dVar23 + 7U & 0xfffffffffffffff8) != uVar29);
    }
    dVar26 = (double)((long)dVar26 + 1);
    pdVar20 = pdVar20 + (long)dVar23;
  } while (dVar26 != dVar42);
LAB_0016fda8:
  math::Sturm::Sturm(&local_1a08,(MatrixXd *)&local_1aa0);
  this = local_1a20;
  if ((double *)
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] != (double *)0x0) {
    free(*(void **)((long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[0] + -8));
  }
  math::Sturm::findRoots(&local_1ab8,&local_1a08);
  local_1a50.m_cols = 0;
  local_1a50.m_data = (double *)0x0;
  local_1a50.m_rows = 0;
  lVar22 = (long)local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  if ((local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar22),0) < 9)) {
    puVar19 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar19 = operator_delete;
    __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1a50,lVar22 * 9,9,lVar22);
  if (local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar29 = 0;
  }
  else {
    lVar22 = 0;
    uVar34 = 0;
    do {
      local_1ad0.m_data =
           (double *)
           local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar34];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = 0.0;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = 0.0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,8,1,8);
      if ((local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] == 4.94065645841247e-324) &&
         (local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] == 3.95252516672997e-323)) {
        dVar42 = 3.95252516672997e-323;
        dVar23 = 4.94065645841247e-324;
LAB_0016fee8:
        dVar26 = 0.0;
        auVar36 = vpbroadcastq_avx512f();
        pdVar20 = (double *)
                  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0];
        do {
          auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < (long)dVar23) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_1800.m_data.array[(long)dVar26];
            auVar38 = vbroadcastsd_avx512f(auVar2);
            uVar29 = 0;
            do {
              auVar39 = vpbroadcastq_avx512f();
              auVar39 = vporq_avx512f(auVar39,auVar37);
              uVar27 = vpcmpuq_avx512f(auVar39,auVar36,2);
              pdVar25 = pdVar20 + uVar29;
              bVar6 = (bool)((byte)uVar27 & 1);
              bVar7 = (bool)((byte)(uVar27 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
              bVar9 = (bool)((byte)(uVar27 >> 3) & 1);
              bVar10 = (bool)((byte)(uVar27 >> 4) & 1);
              bVar11 = (bool)((byte)(uVar27 >> 5) & 1);
              bVar12 = (bool)((byte)(uVar27 >> 6) & 1);
              *pdVar25 = (double)((ulong)bVar6 * auVar38._0_8_ | (ulong)!bVar6 * (long)*pdVar25);
              pdVar25[1] = (double)((ulong)bVar7 * auVar38._8_8_ | (ulong)!bVar7 * (long)pdVar25[1])
              ;
              pdVar25[2] = (double)((ulong)bVar8 * auVar38._16_8_ | (ulong)!bVar8 * (long)pdVar25[2]
                                   );
              pdVar25[3] = (double)((ulong)bVar9 * auVar38._24_8_ | (ulong)!bVar9 * (long)pdVar25[3]
                                   );
              pdVar25[4] = (double)((ulong)bVar10 * auVar38._32_8_ |
                                   (ulong)!bVar10 * (long)pdVar25[4]);
              pdVar25[5] = (double)((ulong)bVar11 * auVar38._40_8_ |
                                   (ulong)!bVar11 * (long)pdVar25[5]);
              pdVar25[6] = (double)((ulong)bVar12 * auVar38._48_8_ |
                                   (ulong)!bVar12 * (long)pdVar25[6]);
              pdVar25[7] = (double)((uVar27 >> 7) * auVar38._56_8_ |
                                   (ulong)!SUB81(uVar27 >> 7,0) * (long)pdVar25[7]);
              uVar29 = uVar29 + 8;
            } while (((long)dVar23 + 7U & 0xfffffffffffffff8) != uVar29);
          }
          dVar26 = (double)((long)dVar26 + 1);
          pdVar20 = pdVar20 + (long)dVar23;
        } while (dVar26 != dVar42);
      }
      else {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,8,1,8);
        if (0 < (long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2]) {
          dVar42 = local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data.array[2];
          dVar23 = local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data.array[1];
          goto LAB_0016fee8;
        }
      }
      local_1a28 = fivept_nister::polyVal((MatrixXd *)&local_1aa0,(double)local_1ad0.m_data);
      local_1ae0 = 0;
      local_1af0 = (undefined1  [16])0x0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)local_1af0,7,1,7);
      if ((local_1af0._8_8_ == 1) && (local_1ae0 == 7)) {
        lVar28 = 7;
        lVar35 = 1;
LAB_0016ffd8:
        lVar31 = 0;
        auVar36 = vpbroadcastq_avx512f();
        pdVar20 = (double *)local_1af0._0_8_;
        do {
          auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < lVar35) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(local_18b0 + lVar31 * 8);
            auVar38 = vbroadcastsd_avx512f(auVar3);
            uVar29 = 0;
            do {
              auVar39 = vpbroadcastq_avx512f();
              auVar39 = vporq_avx512f(auVar39,auVar37);
              uVar27 = vpcmpuq_avx512f(auVar39,auVar36,2);
              pdVar25 = pdVar20 + uVar29;
              bVar6 = (bool)((byte)uVar27 & 1);
              bVar7 = (bool)((byte)(uVar27 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
              bVar9 = (bool)((byte)(uVar27 >> 3) & 1);
              bVar10 = (bool)((byte)(uVar27 >> 4) & 1);
              bVar11 = (bool)((byte)(uVar27 >> 5) & 1);
              bVar12 = (bool)((byte)(uVar27 >> 6) & 1);
              *pdVar25 = (double)((ulong)bVar6 * auVar38._0_8_ | (ulong)!bVar6 * (long)*pdVar25);
              pdVar25[1] = (double)((ulong)bVar7 * auVar38._8_8_ | (ulong)!bVar7 * (long)pdVar25[1])
              ;
              pdVar25[2] = (double)((ulong)bVar8 * auVar38._16_8_ | (ulong)!bVar8 * (long)pdVar25[2]
                                   );
              pdVar25[3] = (double)((ulong)bVar9 * auVar38._24_8_ | (ulong)!bVar9 * (long)pdVar25[3]
                                   );
              pdVar25[4] = (double)((ulong)bVar10 * auVar38._32_8_ |
                                   (ulong)!bVar10 * (long)pdVar25[4]);
              pdVar25[5] = (double)((ulong)bVar11 * auVar38._40_8_ |
                                   (ulong)!bVar11 * (long)pdVar25[5]);
              pdVar25[6] = (double)((ulong)bVar12 * auVar38._48_8_ |
                                   (ulong)!bVar12 * (long)pdVar25[6]);
              pdVar25[7] = (double)((uVar27 >> 7) * auVar38._56_8_ |
                                   (ulong)!SUB81(uVar27 >> 7,0) * (long)pdVar25[7]);
              uVar29 = uVar29 + 8;
            } while ((lVar35 + 7U & 0xfffffffffffffff8) != uVar29);
          }
          lVar31 = lVar31 + 1;
          pdVar20 = pdVar20 + lVar35;
        } while (lVar31 != lVar28);
      }
      else {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)local_1af0,7,1,7);
        if (0 < local_1ae0) {
          lVar28 = local_1ae0;
          lVar35 = local_1af0._8_8_;
          goto LAB_0016ffd8;
        }
      }
      local_1a30 = fivept_nister::polyVal((MatrixXd *)local_1af0,(double)local_1ad0.m_data);
      if ((double *)local_1af0._0_8_ != (double *)0x0) {
        free(*(void **)(local_1af0._0_8_ + -8));
      }
      if ((double *)
          local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] != (double *)0x0) {
        free(*(void **)((long)local_1aa0.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[0] + -8));
      }
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = 0.0;
      local_1a10 = local_1a28 / local_1a30;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      ._0_16_ = ZEXT816(0);
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,8,1,8);
      if ((local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] == 4.94065645841247e-324) &&
         (local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[2] == 3.95252516672997e-323)) {
        dVar42 = 3.95252516672997e-323;
        dVar23 = 4.94065645841247e-324;
LAB_00170109:
        dVar26 = 0.0;
        auVar36 = vpbroadcastq_avx512f();
        pdVar20 = (double *)
                  local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array[0];
        do {
          auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < (long)dVar23) {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_1840.m_data.array[(long)dVar26];
            auVar38 = vbroadcastsd_avx512f(auVar4);
            uVar29 = 0;
            do {
              auVar39 = vpbroadcastq_avx512f();
              auVar39 = vporq_avx512f(auVar39,auVar37);
              uVar27 = vpcmpuq_avx512f(auVar39,auVar36,2);
              pdVar25 = pdVar20 + uVar29;
              bVar6 = (bool)((byte)uVar27 & 1);
              bVar7 = (bool)((byte)(uVar27 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
              bVar9 = (bool)((byte)(uVar27 >> 3) & 1);
              bVar10 = (bool)((byte)(uVar27 >> 4) & 1);
              bVar11 = (bool)((byte)(uVar27 >> 5) & 1);
              bVar12 = (bool)((byte)(uVar27 >> 6) & 1);
              *pdVar25 = (double)((ulong)bVar6 * auVar38._0_8_ | (ulong)!bVar6 * (long)*pdVar25);
              pdVar25[1] = (double)((ulong)bVar7 * auVar38._8_8_ | (ulong)!bVar7 * (long)pdVar25[1])
              ;
              pdVar25[2] = (double)((ulong)bVar8 * auVar38._16_8_ | (ulong)!bVar8 * (long)pdVar25[2]
                                   );
              pdVar25[3] = (double)((ulong)bVar9 * auVar38._24_8_ | (ulong)!bVar9 * (long)pdVar25[3]
                                   );
              pdVar25[4] = (double)((ulong)bVar10 * auVar38._32_8_ |
                                   (ulong)!bVar10 * (long)pdVar25[4]);
              pdVar25[5] = (double)((ulong)bVar11 * auVar38._40_8_ |
                                   (ulong)!bVar11 * (long)pdVar25[5]);
              pdVar25[6] = (double)((ulong)bVar12 * auVar38._48_8_ |
                                   (ulong)!bVar12 * (long)pdVar25[6]);
              pdVar25[7] = (double)((uVar27 >> 7) * auVar38._56_8_ |
                                   (ulong)!SUB81(uVar27 >> 7,0) * (long)pdVar25[7]);
              uVar29 = uVar29 + 8;
            } while (((long)dVar23 + 7U & 0xfffffffffffffff8) != uVar29);
          }
          dVar26 = (double)((long)dVar26 + 1);
          pdVar20 = pdVar20 + (long)dVar23;
        } while (dVar26 != dVar42);
      }
      else {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)&local_1aa0,8,1,8);
        if (0 < (long)local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[2]) {
          dVar42 = local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data.array[2];
          dVar23 = local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                   .m_data.array[1];
          goto LAB_00170109;
        }
      }
      local_1a28 = fivept_nister::polyVal((MatrixXd *)&local_1aa0,(double)local_1ad0.m_data);
      local_1ae0 = 0;
      local_1af0 = (undefined1  [16])0x0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)local_1af0,7,1,7);
      if ((local_1af0._8_8_ == 1) && (local_1ae0 == 7)) {
        lVar28 = 7;
        lVar35 = 1;
LAB_001701f9:
        lVar31 = 0;
        auVar36 = vpbroadcastq_avx512f();
        pdVar20 = (double *)local_1af0._0_8_;
        do {
          auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          if (0 < lVar35) {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(local_18b0 + lVar31 * 8);
            auVar38 = vbroadcastsd_avx512f(auVar5);
            uVar29 = 0;
            do {
              auVar39 = vpbroadcastq_avx512f();
              auVar39 = vporq_avx512f(auVar39,auVar37);
              uVar27 = vpcmpuq_avx512f(auVar39,auVar36,2);
              pdVar25 = pdVar20 + uVar29;
              bVar6 = (bool)((byte)uVar27 & 1);
              bVar7 = (bool)((byte)(uVar27 >> 1) & 1);
              bVar8 = (bool)((byte)(uVar27 >> 2) & 1);
              bVar9 = (bool)((byte)(uVar27 >> 3) & 1);
              bVar10 = (bool)((byte)(uVar27 >> 4) & 1);
              bVar11 = (bool)((byte)(uVar27 >> 5) & 1);
              bVar12 = (bool)((byte)(uVar27 >> 6) & 1);
              *pdVar25 = (double)((ulong)bVar6 * auVar38._0_8_ | (ulong)!bVar6 * (long)*pdVar25);
              pdVar25[1] = (double)((ulong)bVar7 * auVar38._8_8_ | (ulong)!bVar7 * (long)pdVar25[1])
              ;
              pdVar25[2] = (double)((ulong)bVar8 * auVar38._16_8_ | (ulong)!bVar8 * (long)pdVar25[2]
                                   );
              pdVar25[3] = (double)((ulong)bVar9 * auVar38._24_8_ | (ulong)!bVar9 * (long)pdVar25[3]
                                   );
              pdVar25[4] = (double)((ulong)bVar10 * auVar38._32_8_ |
                                   (ulong)!bVar10 * (long)pdVar25[4]);
              pdVar25[5] = (double)((ulong)bVar11 * auVar38._40_8_ |
                                   (ulong)!bVar11 * (long)pdVar25[5]);
              pdVar25[6] = (double)((ulong)bVar12 * auVar38._48_8_ |
                                   (ulong)!bVar12 * (long)pdVar25[6]);
              pdVar25[7] = (double)((uVar27 >> 7) * auVar38._56_8_ |
                                   (ulong)!SUB81(uVar27 >> 7,0) * (long)pdVar25[7]);
              uVar29 = uVar29 + 8;
            } while ((lVar35 + 7U & 0xfffffffffffffff8) != uVar29);
          }
          lVar31 = lVar31 + 1;
          pdVar20 = pdVar20 + lVar35;
        } while (lVar31 != lVar28);
      }
      else {
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                  ((DenseStorage<double,__1,__1,__1,_0> *)local_1af0,7,1,7);
        if (0 < local_1ae0) {
          lVar28 = local_1ae0;
          lVar35 = local_1af0._8_8_;
          goto LAB_001701f9;
        }
      }
      local_1a30 = fivept_nister::polyVal((MatrixXd *)local_1af0,(double)local_1ad0.m_data);
      if ((double *)local_1af0._0_8_ != (double *)0x0) {
        free(*(void **)(local_1af0._0_8_ + -8));
      }
      if ((double *)
          local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] != (double *)0x0) {
        free(*(void **)((long)local_1aa0.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[0] + -8));
      }
      local_1a18 = local_1a28 / local_1a30;
      fivept_nister::pollishCoefficients(&local_1100,&local_1a10,&local_1a18,(double *)&local_1ad0);
      uVar27 = local_1a50.m_rows;
      if ((((ulong)(local_1a50.m_data + local_1a50.m_rows * uVar34) & 7) == 0) &&
         (uVar27 = (ulong)(-((uint)((ulong)(local_1a50.m_data + local_1a50.m_rows * uVar34) >> 3) &
                            0x1fffffff) & 7), local_1a50.m_rows <= (long)uVar27)) {
        uVar27 = local_1a50.m_rows;
      }
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_1a10;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_1a18;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = local_1ad0.m_data;
      uVar30 = local_1a50.m_rows - uVar27;
      uVar29 = uVar30 + 7;
      if (-1 < (long)uVar30) {
        uVar29 = uVar30;
      }
      if (0 < (long)uVar27) {
        uVar32 = 0;
        do {
          *(double *)((long)local_1a50.m_data + uVar32 * 8 + local_1a50.m_rows * lVar22) =
               local_1a10 *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar32] +
               local_1a18 *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar32 + 9] +
               (double)local_1ad0.m_data *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar32 + 0x12] +
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar32 + 0x1b];
          uVar32 = uVar32 + 1;
        } while (uVar27 != uVar32);
      }
      uVar29 = (uVar29 & 0xfffffffffffffff8) + uVar27;
      if (7 < (long)uVar30) {
        auVar36 = vbroadcastsd_avx512f(auVar43);
        auVar37 = vbroadcastsd_avx512f(auVar56);
        auVar38 = vbroadcastsd_avx512f(auVar68);
        do {
          auVar39 = vmulpd_avx512f(auVar36,*(undefined1 (*) [64])
                                            ((EE->
                                             super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>
                                             ).m_storage.m_data.array + uVar27));
          auVar40 = vmulpd_avx512f(auVar37,*(undefined1 (*) [64])
                                            ((EE->
                                             super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>
                                             ).m_storage.m_data.array + uVar27 + 9));
          auVar41 = vmulpd_avx512f(auVar38,*(undefined1 (*) [64])
                                            ((EE->
                                             super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>
                                             ).m_storage.m_data.array + uVar27 + 0x12));
          auVar39 = vaddpd_avx512f(auVar39,auVar40);
          auVar39 = vaddpd_avx512f(auVar39,auVar41);
          auVar39 = vaddpd_avx512f(auVar39,*(undefined1 (*) [64])
                                            ((EE->
                                             super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>
                                             ).m_storage.m_data.array + uVar27 + 0x1b));
          *(undefined1 (*) [64])((long)local_1a50.m_data + uVar27 * 8 + local_1a50.m_rows * lVar22)
               = auVar39;
          uVar27 = uVar27 + 8;
        } while ((long)uVar27 < (long)uVar29);
      }
      if ((long)uVar29 < local_1a50.m_rows) {
        uVar27 = local_1a50.m_rows * lVar22;
        do {
          *(double *)((long)local_1a50.m_data + uVar29 * 8 + uVar27) =
               local_1a10 *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar29] +
               local_1a18 *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar29 + 9] +
               (double)local_1ad0.m_data *
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar29 + 0x12] +
               (EE->super_PlainObjectBase<Eigen::Matrix<double,_9,_4,_0,_9,_4>_>).m_storage.m_data.
               array[uVar29 + 0x1b];
          uVar29 = uVar29 + 1;
        } while (local_1a50.m_rows != uVar29);
      }
      uVar34 = uVar34 + 1;
      lVar22 = lVar22 + 8;
      uVar29 = (long)local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    } while (uVar34 < uVar29);
    local_1ae0 = 0;
    local_1af0 = ZEXT816(0);
    this = local_1a20;
    if ((local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       (auVar13 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar13 / SEXT816((long)uVar29),0) < 1)) {
      puVar19 = (undefined8 *)
                __cxa_allocate_exception(8,uVar27,SUB168(auVar13 % SEXT816((long)uVar29),0));
      *puVar19 = operator_delete;
      __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_1af0 = ZEXT816(0);
  local_1ae0 = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_1af0,uVar29,1,uVar29);
  if (local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar29 = 0;
  }
  else {
    lVar22 = 0;
    uVar34 = 0;
    do {
      dVar42 = 0.0;
      lVar28 = 0;
      *(double *)(local_1af0._0_8_ + local_1af0._8_8_ * uVar34 * 8) = 0.0;
      do {
        dVar23 = *(double *)((long)local_1a50.m_data + lVar28 * 8 + local_1a50.m_rows * lVar22);
        lVar28 = lVar28 + 1;
        dVar42 = dVar23 * dVar23 + dVar42;
        *(double *)(local_1af0._0_8_ + local_1af0._8_8_ * uVar34 * 8) = dVar42;
      } while (lVar28 != 9);
      if (dVar42 < 0.0) {
        dVar42 = sqrt(dVar42);
      }
      else {
        auVar44._8_8_ = 0;
        auVar44._0_8_ = dVar42;
        auVar13 = vsqrtsd_avx(auVar44,auVar44);
        dVar42 = auVar13._0_8_;
      }
      lVar22 = lVar22 + 8;
      lVar28 = local_1af0._8_8_ * uVar34;
      uVar34 = uVar34 + 1;
      *(double *)(local_1af0._0_8_ + lVar28 * 8) = dVar42;
      uVar29 = (long)local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    } while (uVar34 < uVar29);
    local_1ad0.m_cols = 0;
    local_1ad0.m_data = (double *)0x0;
    local_1ad0.m_rows = 0;
    if ((local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       (auVar13 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar13 / SEXT816((long)uVar29),0) < 9)) {
      puVar19 = (undefined8 *)
                __cxa_allocate_exception
                          (8,local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start,
                           SUB168(auVar13 % SEXT816((long)uVar29),0));
      *puVar19 = operator_delete;
      __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_1ad0.m_cols = 0;
  local_1ad0.m_rows = 0;
  local_1ad0.m_data = (double *)0x0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1ad0,uVar29 * 9,9,uVar29);
  lVar22 = 0;
  pdVar20 = local_1ad0.m_data;
  do {
    pdVar25 = pdVar20;
    pdVar33 = (double *)local_1af0._0_8_;
    lVar28 = local_1ad0.m_cols;
    if (0 < local_1ad0.m_cols) {
      do {
        *pdVar25 = *pdVar33;
        lVar28 = lVar28 + -1;
        pdVar25 = pdVar25 + local_1ad0.m_rows;
        pdVar33 = pdVar33 + local_1af0._8_8_;
      } while (lVar28 != 0);
    }
    lVar22 = lVar22 + 1;
    pdVar20 = pdVar20 + 1;
  } while (lVar22 != 9);
  lVar22 = (long)local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  lVar28 = 0;
  do {
    while (local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start) {
      lVar28 = lVar28 + 1;
      if (lVar28 == 9) {
LAB_001707f7:
        if (local_1ad0.m_data != (double *)0x0) {
          free((void *)local_1ad0.m_data[-1]);
        }
        if ((double *)local_1af0._0_8_ != (double *)0x0) {
          free(*(void **)(local_1af0._0_8_ + -8));
        }
        if (local_1a50.m_data != (double *)0x0) {
          free((void *)local_1a50.m_data[-1]);
        }
        if (local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        math::Sturm::~Sturm(&local_1a08);
        return;
      }
    }
    pdVar20 = local_1a50.m_data + lVar28;
    pdVar25 = local_1ad0.m_data + lVar28;
    lVar35 = lVar22 + (ulong)(lVar22 == 0);
    do {
      dVar42 = *pdVar25;
      pdVar25 = pdVar25 + local_1ad0.m_rows;
      *pdVar20 = *pdVar20 / dVar42;
      pdVar20 = pdVar20 + local_1a50.m_rows;
      lVar35 = lVar35 + -1;
    } while (lVar35 != 0);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 9);
  if (local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    uVar29 = 0;
    pdVar21 = local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar24 = local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    do {
      lVar22 = local_1a50.m_rows * uVar29;
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = local_1a50.m_data[lVar22];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = local_1a50.m_data[lVar22 + 1];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = local_1a50.m_data[lVar22 + 2];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = local_1a50.m_data[lVar22 + 3];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = local_1a50.m_data[lVar22 + 4];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [7] = local_1a50.m_data[lVar22 + 5];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = local_1a50.m_data[lVar22 + 6];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = local_1a50.m_data[lVar22 + 7];
      local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = local_1a50.m_data[lVar22 + 8];
      __position._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8);
      if (__position._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 0x10)) {
        std::
        vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
        ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>(this,__position,&local_1aa0);
        pdVar21 = local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar24 = local_1ab8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      else {
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[8] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[8];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[0] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[1] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[1];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[2] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[2];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[3] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[4] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[4];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[5] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[6] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6];
        ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
        m_storage.m_data.array[7] =
             local_1aa0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[7];
        *(long *)(this + 8) = *(long *)(this + 8) + 0x48;
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 < (ulong)((long)pdVar24 - (long)pdVar21 >> 3));
  }
  goto LAB_001707f7;
}

Assistant:

void
opengv::relative_pose::modules::fivept_nister_main(
    const Eigen::Matrix<double,9,4> & EE,
    essentials_t & essentials )
{
  Eigen::Matrix<double,10,20> A;
  fivept_nister::composeA(EE,A);

  Eigen::Matrix<double,10,10> A1 = A.block(0,0,10,10);
  Eigen::Matrix<double,10,10> A2 = A.block(0,10,10,10);

  Eigen::FullPivLU< Eigen::Matrix<double,10,10> > luA1(A1);
  Eigen::Matrix<double,10,10> A3 = luA1.inverse()*A2;

  Eigen::Matrix<double,1,4> b11_part1 = Eigen::Matrix<double,1,4>::Zero();
  b11_part1.block<1,3>(0,1) = A3.block<1,3>(4,0);
  Eigen::Matrix<double,1,4> b11_part2 = Eigen::Matrix<double,1,4>::Zero();
  b11_part2.block<1,3>(0,0) = A3.block<1,3>(5,0);
  Eigen::Matrix<double,1,4> b11 = b11_part1 - b11_part2;

  Eigen::Matrix<double,1,4> b21_part1 = Eigen::Matrix<double,1,4>::Zero();
  b21_part1.block<1,3>(0,1) = A3.block<1,3>(6,0);
  Eigen::Matrix<double,1,4> b21_part2 = Eigen::Matrix<double,1,4>::Zero();
  b21_part2.block<1,3>(0,0) = A3.block<1,3>(7,0);
  Eigen::Matrix<double,1,4> b21 = b21_part1 - b21_part2;

  Eigen::Matrix<double,1,4> b31_part1 = Eigen::Matrix<double,1,4>::Zero();
  b31_part1.block<1,3>(0,1) = A3.block<1,3>(8,0);
  Eigen::Matrix<double,1,4> b31_part2 = Eigen::Matrix<double,1,4>::Zero();
  b31_part2.block<1,3>(0,0) = A3.block<1,3>(9,0);
  Eigen::Matrix<double,1,4> b31 = b31_part1 - b31_part2;

  Eigen::Matrix<double,1,4> b12_part1 = Eigen::Matrix<double,1,4>::Zero();
  b12_part1.block<1,3>(0,1) = A3.block<1,3>(4,3);
  Eigen::Matrix<double,1,4> b12_part2 = Eigen::Matrix<double,1,4>::Zero();
  b12_part2.block<1,3>(0,0) = A3.block<1,3>(5,3);
  Eigen::Matrix<double,1,4> b12 = b12_part1 - b12_part2;

  Eigen::Matrix<double,1,4> b22_part1 = Eigen::Matrix<double,1,4>::Zero();
  b22_part1.block<1,3>(0,1) = A3.block<1,3>(6,3);
  Eigen::Matrix<double,1,4> b22_part2 = Eigen::Matrix<double,1,4>::Zero();
  b22_part2.block<1,3>(0,0) = A3.block<1,3>(7,3);
  Eigen::Matrix<double,1,4> b22 = b22_part1 - b22_part2;

  Eigen::Matrix<double,1,4> b32_part1 = Eigen::Matrix<double,1,4>::Zero();
  b32_part1.block<1,3>(0,1) = A3.block<1,3>(8,3);
  Eigen::Matrix<double,1,4> b32_part2 = Eigen::Matrix<double,1,4>::Zero();
  b32_part2.block<1,3>(0,0) = A3.block<1,3>(9,3);
  Eigen::Matrix<double,1,4> b32 = b32_part1 - b32_part2;

  Eigen::Matrix<double,1,5> b13_part1 = Eigen::Matrix<double,1,5>::Zero();
  b13_part1.block<1,4>(0,1) = A3.block<1,4>(4,6);
  Eigen::Matrix<double,1,5> b13_part2 = Eigen::Matrix<double,1,5>::Zero();
  b13_part2.block<1,4>(0,0) = A3.block<1,4>(5,6);
  Eigen::Matrix<double,1,5> b13 = b13_part1 - b13_part2;

  Eigen::Matrix<double,1,5> b23_part1 = Eigen::Matrix<double,1,5>::Zero();
  b23_part1.block<1,4>(0,1) = A3.block<1,4>(6,6);
  Eigen::Matrix<double,1,5> b23_part2 = Eigen::Matrix<double,1,5>::Zero();
  b23_part2.block<1,4>(0,0) = A3.block<1,4>(7,6);
  Eigen::Matrix<double,1,5> b23 = b23_part1 - b23_part2;

  Eigen::Matrix<double,1,5> b33_part1 = Eigen::Matrix<double,1,5>::Zero();
  b33_part1.block<1,4>(0,1) = A3.block<1,4>(8,6);
  Eigen::Matrix<double,1,5> b33_part2 = Eigen::Matrix<double,1,5>::Zero();
  b33_part2.block<1,4>(0,0) = A3.block<1,4>(9,6);
  Eigen::Matrix<double,1,5> b33 = b33_part1 - b33_part2;

  Eigen::Matrix<double,1,8> p1_part1;
  fivept_nister::computeSeventhOrderPolynomial(b23,b12,p1_part1);
  Eigen::Matrix<double,1,8> p1_part2;
  fivept_nister::computeSeventhOrderPolynomial(b13,b22,p1_part2);
  Eigen::Matrix<double,1,8> p1 = p1_part1 - p1_part2;
  Eigen::Matrix<double,1,8> p2_part1;
  fivept_nister::computeSeventhOrderPolynomial(b13,b21,p2_part1);
  Eigen::Matrix<double,1,8> p2_part2;
  fivept_nister::computeSeventhOrderPolynomial(b23,b11,p2_part2);
  Eigen::Matrix<double,1,8> p2 = p2_part1 - p2_part2;
  Eigen::Matrix<double,1,7> p3_part1;
  fivept_nister::computeSixthOrderPolynomial(b11,b22,p3_part1);
  Eigen::Matrix<double,1,7> p3_part2;
  fivept_nister::computeSixthOrderPolynomial(b12,b21,p3_part2);
  Eigen::Matrix<double,1,7> p3 = p3_part1 - p3_part2;

  Eigen::Matrix<double,1,11> p_order10_part1;
  fivept_nister::computeTenthOrderPolynomialFrom73(p1,b31,p_order10_part1);
  Eigen::Matrix<double,1,11> p_order10_part2;
  fivept_nister::computeTenthOrderPolynomialFrom73(p2,b32,p_order10_part2);
  Eigen::Matrix<double,1,11> p_order10_part3;
  fivept_nister::computeTenthOrderPolynomialFrom64(p3,b33,p_order10_part3);
  Eigen::Matrix<double,1,11> p_order10 =
      p_order10_part1 + p_order10_part2 + p_order10_part3;

  math::Sturm sturmSequence(p_order10);
  std::vector<double> roots = sturmSequence.findRoots();

  Eigen::MatrixXd Evec(9,roots.size());

  for( size_t i = 0; i < roots.size(); i++ )
  {
    double z = roots[i];
    double x = fivept_nister::polyVal(p1,z)/fivept_nister::polyVal(p3,z);
    double y = fivept_nister::polyVal(p2,z)/fivept_nister::polyVal(p3,z);

    //pollishing here
    fivept_nister::pollishCoefficients(A,x,y,z);

    Evec.col(i) = x*EE.col(0) + y*EE.col(1) + z*EE.col(2) + EE.col(3);
  }

  Eigen::MatrixXd norms(1,roots.size());
  for( size_t c = 0; c < roots.size(); c++ )
  {
    norms(0,c) = 0.0;

    for( int r = 0; r < 9; r++ )
      norms(0,c) += pow( Evec(r,c), 2 );

    norms(0,c) = sqrt(norms(0,c));
  }

  Eigen::MatrixXd EvecNorms(9,roots.size());
  for( size_t i = 0; i < 9; i++ )
    EvecNorms.row(i) = norms;

  for( size_t r = 0; r < 9; r++ )
  {
    for( size_t c = 0; c < roots.size(); c++ )
      Evec(r,c) = Evec(r,c) / EvecNorms(r,c);
  }

  for( size_t c = 0; c < roots.size(); c++ )
  {
    essential_t essential;

    essential.row(0) = Evec.block<3,1>(0,c).transpose();
    essential.row(1) = Evec.block<3,1>(3,c).transpose();
    essential.row(2) = Evec.block<3,1>(6,c).transpose();

    essentials.push_back(essential);
  }
}